

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_point_query_base.h
# Opt level: O0

bool __thiscall
S2ClosestPointQueryBase<S2MinDistance,_int>::ProcessOrEnqueue
          (S2ClosestPointQueryBase<S2MinDistance,_int> *this,S2CellId id,Iterator *iter,bool seek)

{
  bool bVar1;
  uint uVar2;
  S2CellId SVar3;
  S2CellId x;
  Options *pOVar4;
  S2Region *pSVar5;
  PointData *pPVar6;
  bool local_10a;
  bool local_109;
  int local_f4;
  int i;
  QueueEntry local_e0;
  double local_d0;
  S2MinDistance local_c8;
  S1ChordAngle local_c0;
  S1ChordAngle local_a8;
  S2MinDistance distance;
  undefined1 local_98 [8];
  S2Cell cell;
  int local_50;
  int num_points;
  S2CellId last;
  bool seek_local;
  Iterator *iter_local;
  S2ClosestPointQueryBase<S2MinDistance,_int> *this_local;
  S2CellId id_local;
  
  unique0x10000349 = id.id_;
  if (seek) {
    SVar3 = S2CellId::range_min((S2CellId *)((long)&this_local + 7));
    S2PointIndex<int>::Iterator::Seek(iter,SVar3);
  }
  bVar1 = S2CellId::is_leaf((S2CellId *)((long)&this_local + 7));
  if (bVar1) {
    while( true ) {
      bVar1 = S2PointIndex<int>::Iterator::done(iter);
      local_109 = false;
      if (!bVar1) {
        SVar3 = S2PointIndex<int>::Iterator::id(iter);
        local_109 = ::operator==(SVar3,stack0xffffffffffffffef);
      }
      if (local_109 == false) break;
      pPVar6 = S2PointIndex<int>::Iterator::point_data(iter);
      MaybeAddResult(this,pPVar6);
      S2PointIndex<int>::Iterator::Next(iter);
    }
    id_local.id_._0_1_ = 0;
    goto LAB_004029da;
  }
  SVar3 = S2CellId::range_max((S2CellId *)((long)&this_local + 7));
  local_50 = 0;
  while( true ) {
    bVar1 = S2PointIndex<int>::Iterator::done(iter);
    local_10a = false;
    if (!bVar1) {
      x = S2PointIndex<int>::Iterator::id(iter);
      cell.uv_.bounds_[1].bounds_.c_[1] = (VType)SVar3;
      local_10a = operator<=(x,SVar3);
    }
    if (local_10a == false) {
      for (local_f4 = 0; local_f4 < local_50; local_f4 = local_f4 + 1) {
        MaybeAddResult(this,this->tmp_point_data_[local_f4]);
      }
      id_local.id_._0_1_ = 0;
      goto LAB_004029da;
    }
    if (local_50 == 0xc) break;
    pPVar6 = S2PointIndex<int>::Iterator::point_data(iter);
    this->tmp_point_data_[local_50] = pPVar6;
    S2PointIndex<int>::Iterator::Next(iter);
    local_50 = local_50 + 1;
  }
  distance.super_S1ChordAngle.length2_ = (S1ChordAngle)(S1ChordAngle)stack0xffffffffffffffef;
  S2Cell::S2Cell((S2Cell *)local_98,stack0xffffffffffffffef);
  local_a8.length2_ = (this->distance_limit_).super_S1ChordAngle.length2_;
  uVar2 = (*this->target_->_vptr_S2DistanceTarget[5])(this->target_,(S2Cell *)local_98,&local_a8);
  if ((uVar2 & 1) != 0) {
    pOVar4 = options(this);
    pSVar5 = S2ClosestPointQueryBaseOptions<S2MinDistance>::region(pOVar4);
    if (pSVar5 != (S2Region *)0x0) {
      pOVar4 = options(this);
      pSVar5 = S2ClosestPointQueryBaseOptions<S2MinDistance>::region(pOVar4);
      uVar2 = (*pSVar5->_vptr_S2Region[7])(pSVar5,local_98);
      if ((uVar2 & 1) == 0) goto LAB_0040294c;
    }
    if ((this->use_conservative_cell_distance_ & 1U) != 0) {
      local_c8.super_S1ChordAngle.length2_ = (S1ChordAngle)(S1ChordAngle)local_a8.length2_;
      pOVar4 = options(this);
      local_d0 = (double)S2ClosestPointQueryBaseOptions<S2MinDistance>::max_error(pOVar4);
      local_c0.length2_ = (double)::operator-(local_c8,(S1ChordAngle)local_d0);
      local_a8.length2_ = local_c0.length2_;
    }
    QueueEntry::QueueEntry(&local_e0,(S2MinDistance)local_a8.length2_,stack0xffffffffffffffef);
    std::
    priority_queue<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>,_std::less<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
    ::push(&this->queue_,&local_e0);
  }
LAB_0040294c:
  id_local.id_._0_1_ = 1;
  S2Cell::~S2Cell((S2Cell *)local_98);
LAB_004029da:
  return (bool)((byte)id_local.id_ & 1);
}

Assistant:

bool S2ClosestPointQueryBase<Distance, Data>::ProcessOrEnqueue(
    S2CellId id, Iterator* iter, bool seek) {
  if (seek) iter->Seek(id.range_min());
  if (id.is_leaf()) {
    // Leaf cells can't be subdivided.
    for (; !iter->done() && iter->id() == id; iter->Next()) {
      MaybeAddResult(&iter->point_data());
    }
    return false;  // No need to seek to next child.
  }
  S2CellId last = id.range_max();
  int num_points = 0;
  for (; !iter->done() && iter->id() <= last; iter->Next()) {
    if (num_points == kMinPointsToEnqueue - 1) {
      // This cell has too many points (including this one), so enqueue it.
      S2Cell cell(id);
      Distance distance = distance_limit_;
      // We check "region_" second because it may be relatively expensive.
      if (target_->UpdateMinDistance(cell, &distance) &&
          (!options().region() || options().region()->MayIntersect(cell))) {
        if (use_conservative_cell_distance_) {
          // Ensure that "distance" is a lower bound on distance to the cell.
          distance = distance - options().max_error();
        }
        queue_.push(QueueEntry(distance, id));
      }
      return true;  // Seek to next child.
    }
    tmp_point_data_[num_points++] = &iter->point_data();
  }
  // There were few enough points that we might as well process them now.
  for (int i = 0; i < num_points; ++i) {
    MaybeAddResult(tmp_point_data_[i]);
  }
  return false;  // No need to seek to next child.
}